

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O0

bool __thiscall Polymer::CheckPolCollisions(Polymer *this,int pol_index)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  string *psVar5;
  runtime_error *this_00;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string err;
  Ptr next_pol;
  undefined1 local_30 [8];
  Ptr this_pol;
  int pol_index_local;
  Polymer *this_local;
  
  this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       pol_index;
  MobileElementManager::GetPol((MobileElementManager *)local_30,(int)&this->polymerases_);
  bVar1 = MobileElementManager::ValidIndex
                    (&this->polymerases_,
                     this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_ + 1);
  if (!bVar1) {
    this_local._7_1_ = false;
    goto LAB_0011fe81;
  }
  MobileElementManager::GetPol((MobileElementManager *)((long)&err.field_2 + 8),(int)this + 0x90);
  peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  iVar2 = MobileElement::stop(peVar4);
  peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(err.field_2._M_local_buf + 8));
  iVar3 = MobileElement::start(peVar4);
  if (iVar2 < iVar3) {
LAB_0011fe60:
    this_local._7_1_ = false;
  }
  else {
    peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(err.field_2._M_local_buf + 8));
    iVar2 = MobileElement::stop(peVar4);
    peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    iVar3 = MobileElement::start(peVar4);
    if (iVar2 < iVar3) goto LAB_0011fe60;
    peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    iVar2 = MobileElement::stop(peVar4);
    peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(err.field_2._M_local_buf + 8));
    iVar3 = MobileElement::start(peVar4);
    if (3 < iVar2 - iVar3) {
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      psVar5 = MobileElement::name_abi_cxx11_(peVar4);
      std::operator+(&local_270,"Polymerase ",psVar5);
      std::operator+(&local_250,&local_270," (start: ");
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      iVar2 = MobileElement::start(peVar4);
      std::__cxx11::to_string(&local_290,iVar2);
      std::operator+(&local_230,&local_250,&local_290);
      std::operator+(&local_210,&local_230,", stop: ");
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      iVar2 = MobileElement::stop(peVar4);
      std::__cxx11::to_string(&local_2b0,iVar2);
      std::operator+(&local_1f0,&local_210,&local_2b0);
      std::operator+(&local_1d0,&local_1f0,", index: ");
      std::__cxx11::to_string
                (&local_2d0,
                 this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._4_4_);
      std::operator+(&local_1b0,&local_1d0,&local_2d0);
      std::operator+(&local_190,&local_1b0,") is overlapping polymerase ");
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(err.field_2._M_local_buf + 8));
      psVar5 = MobileElement::name_abi_cxx11_(peVar4);
      std::operator+(&local_170,&local_190,psVar5);
      std::operator+(&local_150,&local_170," (start: ");
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(err.field_2._M_local_buf + 8));
      iVar2 = MobileElement::start(peVar4);
      std::__cxx11::to_string(&local_2f0,iVar2);
      std::operator+(&local_130,&local_150,&local_2f0);
      std::operator+(&local_110,&local_130,", stop: ");
      peVar4 = std::__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MobileElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(err.field_2._M_local_buf + 8));
      iVar2 = MobileElement::stop(peVar4);
      std::__cxx11::to_string(&local_310,iVar2);
      std::operator+(&local_f0,&local_110,&local_310);
      std::operator+(&local_d0,&local_f0,", index: ");
      std::__cxx11::to_string
                (&local_330,
                 this_pol.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._4_4_ + 1);
      std::operator+(&local_b0,&local_d0,&local_330);
      std::operator+(&local_90,&local_b0,") by more than one position on polymer ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     &local_90,&this->name_);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,(string *)local_70);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._7_1_ = true;
  }
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)((long)&err.field_2 + 8))
  ;
LAB_0011fe81:
  std::shared_ptr<MobileElement>::~shared_ptr((shared_ptr<MobileElement> *)local_30);
  return this_local._7_1_;
}

Assistant:

bool Polymer::CheckPolCollisions(int pol_index) {
  auto this_pol = polymerases_.GetPol(pol_index);
  if (!polymerases_.ValidIndex(pol_index + 1)) {
    // Are there any polymerases ahead of this one?
    return false;
  }
  auto next_pol = polymerases_.GetPol(pol_index + 1);
  // We only need to check the polymerase one position ahead of this
  // polymerase
  if ((this_pol->stop() >= next_pol->start()) &&
      (next_pol->stop() >= this_pol->start())) {
    // Error checking. TODO: Can this be removed?
    if (this_pol->stop() - next_pol->start() > 3) {
      std::string err = "Polymerase " + this_pol->name() +
                        " (start: " + std::to_string(this_pol->start()) +
                        ", stop: " + std::to_string(this_pol->stop()) +
                        ", index: " + std::to_string(pol_index) +
                        ") is overlapping polymerase " + next_pol->name() +
                        " (start: " + std::to_string(next_pol->start()) +
                        ", stop: " + std::to_string(next_pol->stop()) +
                        ", index: " + std::to_string(pol_index + 1) +
                        ") by more than one position on polymer " + name_;
      throw std::runtime_error(err);
    }
    return true;
  }
  return false;
}